

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_e0bd75::FreeDesktopTrashOperation::tryCreateInfoFile
          (FreeDesktopTrashOperation *this,QString *filePath,QSystemError *error)

{
  int iVar1;
  int *piVar2;
  QSystemError *in_RDX;
  long in_RDI;
  long in_FS_OFFSET;
  bool bVar3;
  QByteArray p;
  QStringBuilder<QByteArray,_const_char_(&)[11]> *in_stack_ffffffffffffff38;
  mode_t in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  int in_stack_ffffffffffffff54;
  QSystemError local_68 [8];
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  QFile::encodeName((QString *)in_stack_ffffffffffffff38);
  ::operator+((QByteArray *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
              (char (*) [11])CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  ::QStringBuilder::operator_cast_to_QByteArray(in_stack_ffffffffffffff38);
  QStringBuilder<QByteArray,_const_char_(&)[11]>::~QStringBuilder
            ((QStringBuilder<QByteArray,_const_char_(&)[11]> *)0x6a05c5);
  QByteArray::~QByteArray((QByteArray *)0x6a05cf);
  QByteArray::operator_cast_to_char_((QByteArray *)0x6a05e8);
  iVar1 = qt_safe_openat(in_stack_ffffffffffffff54,
                         (char *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
                         in_stack_ffffffffffffff44,in_stack_ffffffffffffff40);
  *(int *)(in_RDI + 0x58) = iVar1;
  bVar3 = -1 < *(int *)(in_RDI + 0x58);
  if (bVar3) {
    QByteArray::operator=
              ((QByteArray *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
               &in_stack_ffffffffffffff38->a);
  }
  else {
    piVar2 = __errno_location();
    QSystemError::QSystemError(local_68,*piVar2,StandardLibraryError);
    *in_RDX = local_68[0];
  }
  QByteArray::~QByteArray((QByteArray *)0x6a06e1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool tryCreateInfoFile(const QString &filePath, QSystemError &error)
    {
        QByteArray p = QFile::encodeName(filePath) + ".trashinfo";
        infoFileFd = qt_safe_openat(infoDirFd, p, QT_OPEN_RDWR | QT_OPEN_CREAT | QT_OPEN_EXCL, 0666);
        if (infoFileFd < 0) {
            error = QSystemError(errno, QSystemError::StandardLibraryError);
            return false;
        }
        infoFilePath = std::move(p);
        return true;
    }